

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O0

void * __thiscall tcmalloc::ThreadCache::Alloc(ThreadCache *this,size_t size,uint64_t cl)

{
  bool bVar1;
  uint64_t uVar2;
  void *local_28;
  void *rv;
  uint64_t cl_local;
  size_t size_local;
  ThreadCache *this_local;
  
  rv = (void *)cl;
  cl_local = size;
  size_local = (size_t)this;
  if (cl == 0 || 0x55 < cl) {
    __assert_fail("0 < cl && cl < kMaxClass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/thread_cache.hpp"
                  ,0x25,"void *tcmalloc::ThreadCache::Alloc(size_t, uint64_t)");
  }
  bVar1 = ThreadCacheFreeList::TryPop(this->freelists_ + cl,&local_28);
  if (!bVar1) {
    FetchFromCentralCache(this,this->freelists_ + (long)rv);
    ThreadCacheFreeList::TryPop(this->freelists_ + (long)rv,&local_28);
  }
  uVar2 = ClassSize((int)rv);
  this->size_ = this->size_ - uVar2;
  this->total_alloc_ = uVar2 + this->total_alloc_;
  return local_28;
}

Assistant:

void* Alloc(size_t size, uint64_t cl) {
        assert(0 < cl && cl < kMaxClass);
        void* rv;
        if (!freelists_[cl].TryPop(&rv)) {
            FetchFromCentralCache(freelists_[cl]);
            freelists_[cl].TryPop(&rv);
        }
        size = ClassSize(cl);
        size_ -= size;
        total_alloc_ += size;
        return rv;
    }